

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-dos.cc
# Opt level: O3

void __thiscall
DataSourceDOS::SpriteDosOverlay::SpriteDosOverlay
          (SpriteDosOverlay *this,PBuffer *_data,ColorDOS *palette,uchar value)

{
  byte bVar1;
  uchar value_00;
  uchar value_01;
  element_type *peVar2;
  byte *pbVar3;
  bool bVar4;
  uint8_t *puVar5;
  ulong uVar6;
  ColorDOS *pCVar7;
  PMutableBuffer result;
  undefined1 local_61;
  MutableBuffer *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  SpriteDosOverlay *local_50;
  PBuffer local_48;
  EndianessMode local_34;
  
  local_48.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (_data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_48.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_48.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_48.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  SpriteBaseDOS::SpriteBaseDOS(&this->super_SpriteBaseDOS,&local_48);
  if (local_48.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  (this->super_SpriteBaseDOS).super_SpriteBase.super_Sprite._vptr_Sprite =
       (_func_int **)&PTR_get_data_00156f78;
  local_34 = EndianessBig;
  local_50 = this;
  std::__shared_ptr<MutableBuffer,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<MutableBuffer>,Buffer::EndianessMode>
            ((__shared_ptr<MutableBuffer,(__gnu_cxx::_Lock_policy)2> *)&local_60,
             (allocator<MutableBuffer> *)&local_61,&local_34);
  pCVar7 = palette + value;
  while (bVar4 = Buffer::readable((_data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr), bVar4) {
    peVar2 = (_data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pbVar3 = peVar2->read;
    bVar1 = *pbVar3;
    peVar2->read = pbVar3 + 1;
    MutableBuffer::push<unsigned_int>(local_60,0,(ulong)bVar1);
    peVar2 = (_data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pbVar3 = peVar2->read;
    bVar1 = *pbVar3;
    peVar2->read = pbVar3 + 1;
    for (uVar6 = (ulong)bVar1; uVar6 != 0; uVar6 = uVar6 - 1) {
      value_00 = pCVar7->r;
      value_01 = pCVar7->g;
      MutableBuffer::push<unsigned_char>(local_60,pCVar7->b,1);
      MutableBuffer::push<unsigned_char>(local_60,value_01,1);
      MutableBuffer::push<unsigned_char>(local_60,value_00,1);
      MutableBuffer::push<unsigned_char>(local_60,value,1);
    }
  }
  puVar5 = (uint8_t *)MutableBuffer::unfix(local_60);
  (local_50->super_SpriteBaseDOS).super_SpriteBase.data = puVar5;
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return;
}

Assistant:

DataSourceDOS::SpriteDosOverlay::SpriteDosOverlay(PBuffer _data,
                                                  ColorDOS *palette,
                                                  unsigned char value)
  : SpriteBaseDOS(_data) {
  PMutableBuffer result = std::make_shared<MutableBuffer>(Buffer::EndianessBig);

  while (_data->readable()) {
    size_t drop = _data->pop<uint8_t>();
    result->push<uint32_t>(0x00000000, drop);

    size_t fill = _data->pop<uint8_t>();
    for (size_t i = 0; i < fill; i++) {
      ColorDOS color = palette[value];
      result->push<uint8_t>(color.b);  // Blue
      result->push<uint8_t>(color.g);  // Green
      result->push<uint8_t>(color.r);  // Red
      result->push<uint8_t>(value);    // Alpha
    }
  }

  data = reinterpret_cast<uint8_t*>(result->unfix());
}